

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

bool filesystem::create_subdirectory(path *p)

{
  bool bVar1;
  pointer this;
  reference p_00;
  undefined1 local_a0 [16];
  reverse_iterator ancestor;
  undefined1 local_58 [8];
  vector<filesystem::path,_std::allocator<filesystem::path>_> hierarchy;
  path tmp;
  path *p_local;
  
  path::path((path *)&hierarchy.
                      super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,p);
  std::vector<filesystem::path,_std::allocator<filesystem::path>_>::vector
            ((vector<filesystem::path,_std::allocator<filesystem::path>_> *)local_58);
  while (bVar1 = path::empty((path *)&hierarchy.
                                      super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::vector<filesystem::path,_std::allocator<filesystem::path>_>::push_back
              ((vector<filesystem::path,_std::allocator<filesystem::path>_> *)local_58,
               (value_type *)
               &hierarchy.super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    path::parent_path((path *)&ancestor,
                      (path *)&hierarchy.
                               super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    path::operator=((path *)&hierarchy.
                             super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(path *)&ancestor);
    path::~path((path *)&ancestor);
  }
  std::vector<filesystem::path,_std::allocator<filesystem::path>_>::rbegin
            ((vector<filesystem::path,_std::allocator<filesystem::path>_> *)(local_a0 + 8));
  do {
    std::vector<filesystem::path,_std::allocator<filesystem::path>_>::rend
              ((vector<filesystem::path,_std::allocator<filesystem::path>_> *)local_a0);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
                             *)(local_a0 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
                             *)local_a0);
    if (!bVar1) {
      p_local._7_1_ = true;
LAB_00109ed3:
      std::vector<filesystem::path,_std::allocator<filesystem::path>_>::~vector
                ((vector<filesystem::path,_std::allocator<filesystem::path>_> *)local_58);
      path::~path((path *)&hierarchy.
                           super__Vector_base<filesystem::path,_std::allocator<filesystem::path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      return p_local._7_1_;
    }
    this = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
                         *)(local_a0 + 8));
    bVar1 = path::exists(this);
    if (!bVar1) {
      p_00 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
                          *)(local_a0 + 8));
      bVar1 = create_directory(p_00);
      if (!bVar1) {
        p_local._7_1_ = false;
        goto LAB_00109ed3;
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<filesystem::path_*,_std::vector<filesystem::path,_std::allocator<filesystem::path>_>_>_>
                  *)(local_a0 + 8));
  } while( true );
}

Assistant:

inline bool create_subdirectory(const path& p) {
    auto tmp = p;
    std::vector<path> hierarchy;
    while (!tmp.empty()) {
        hierarchy.push_back(tmp);
        tmp = tmp.parent_path();
    }

    for (auto ancestor = hierarchy.rbegin(); ancestor != hierarchy.rend(); ++ancestor) {
        if (ancestor->exists())
            continue;
        if (!create_directory(*ancestor))
            return false;
    }

    return true;
}